

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityPrintNumberHex(_U_UINT number,char nibbles_to_print)

{
  char cVar1;
  ulong uVar2;
  undefined1 local_21;
  char nibbles;
  _U_UINT nibble;
  char nibbles_to_print_local;
  _U_UINT number_local;
  
  local_21 = nibbles_to_print;
  while ('\0' < local_21) {
    local_21 = local_21 + -1;
    uVar2 = number >> (local_21 * '\x04' & 0x3fU) & 0xf;
    cVar1 = (char)uVar2;
    if (uVar2 < 10) {
      putchar((int)(char)(cVar1 + '0'));
    }
    else {
      putchar((int)(char)(cVar1 + '7'));
    }
  }
  return;
}

Assistant:

void UnityPrintNumberHex(const _U_UINT number, const char nibbles_to_print)
{
    _U_UINT nibble;
    char nibbles = nibbles_to_print;

    while (nibbles > 0)
    {
        nibble = (number >> (--nibbles << 2)) & 0x0000000F;
        if (nibble <= 9)
        {
            UNITY_OUTPUT_CHAR((char)('0' + nibble));
        }
        else
        {
            UNITY_OUTPUT_CHAR((char)('A' - 10 + nibble));
        }
    }
}